

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMpsFF.cpp
# Opt level: O2

Parsekey __thiscall
free_format_parser::HMpsFF::parseQuadRows
          (HMpsFF *this,HighsLogOptions *log_options,istream *file,Parsekey keyword)

{
  bool bVar1;
  Parsekey PVar2;
  HighsInt HVar3;
  iterator iVar4;
  size_t sVar5;
  bool *end_00;
  HMpsFF *this_00;
  int iVar6;
  double dVar7;
  bool is_nan;
  Parsekey local_14c;
  bool skip;
  HighsInt local_144;
  HMpsFF *local_140;
  bool skip_1;
  HMpsFF *local_130;
  size_t end;
  Parsekey local_11c;
  istream *local_118;
  string row_name;
  size_t begin;
  int local_e8;
  HighsInt local_e4;
  string col_name;
  string section_name;
  string coeff_name;
  string rowname;
  string strline;
  
  section_name._M_dataplus._M_p = (pointer)&section_name.field_2;
  section_name._M_string_length = 0;
  section_name.field_2._M_local_buf[0] = '\0';
  local_140 = (HMpsFF *)log_options;
  local_11c = keyword;
  local_118 = file;
  std::__cxx11::string::assign((char *)&section_name);
  strline._M_dataplus._M_p = (pointer)&strline.field_2;
  strline._M_string_length = 0;
  col_name._M_dataplus._M_p = (pointer)&col_name.field_2;
  col_name._M_string_length = 0;
  strline.field_2._M_local_buf[0] = '\0';
  row_name._M_dataplus._M_p = (pointer)&row_name.field_2;
  row_name._M_string_length = 0;
  coeff_name._M_dataplus._M_p = (pointer)&coeff_name.field_2;
  coeff_name._M_string_length = 0;
  col_name.field_2._M_local_buf[0] = '\0';
  row_name.field_2._M_local_buf[0] = '\0';
  coeff_name.field_2._M_local_buf[0] = '\0';
  first_word(&rowname,&this->section_args,0);
  if (rowname._M_string_length == 0) {
    highsLogUser((HighsLogOptions *)local_140,kError,"No row name given in argument of %s\n",
                 section_name._M_dataplus._M_p);
    PVar2 = kFail;
    goto LAB_0022630b;
  }
  this_00 = (HMpsFF *)&this->rowname2idx;
  iVar4 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)this_00,&rowname);
  if (iVar4.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
      ._M_cur == (__node_type *)0x0) {
    this->warning_issued_ = true;
    this_00 = local_140;
    highsLogUser((HighsLogOptions *)local_140,kWarning,
                 "Row name \"%s\" in %s section is not defined: ignored\n",rowname._M_dataplus._M_p,
                 section_name._M_dataplus._M_p);
  }
  else {
    iVar6 = *(int *)((long)iVar4.
                           super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
                           ._M_cur + 0x28);
    if ((long)iVar6 != -2) {
      if (iVar6 < 0) {
        if (iVar6 != -1) goto LAB_0022606e;
        local_130 = (HMpsFF *)&this->q_entries;
      }
      else {
        this_00 = (HMpsFF *)&this->qrows_entries;
        std::
        vector<std::vector<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>,_std::allocator<std::vector<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>_>_>
        ::resize((vector<std::vector<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>,_std::allocator<std::vector<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>_>_>
                  *)this_00,(long)this->num_row);
LAB_0022606e:
        local_130 = (HMpsFF *)
                    ((this->qrows_entries).
                     super__Vector_base<std::vector<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>,_std::allocator<std::vector<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + iVar6);
      }
      local_14c = kFail;
LAB_0022609a:
      bVar1 = getMpsLine(this_00,local_118,&strline,&skip);
      PVar2 = local_14c;
      if (bVar1) {
        if (skip == false) {
          bVar1 = timeout(this);
          if (bVar1) goto LAB_00226289;
          end = 0;
          _skip_1 = 0;
          end_00 = &skip_1;
          PVar2 = checkFirstWord(this,&strline,&end,(size_t *)end_00,&col_name);
          if (PVar2 != kNone) {
            highsLogDev((HighsLogOptions *)local_140,kInfo,"readMPS: Read %s  OK\n",
                        section_name._M_dataplus._M_p);
            local_14c = PVar2;
            goto LAB_0022630b;
          }
          this_00 = this;
          local_144 = getColIdx(this,&col_name,true);
          iVar6 = 3;
          sVar5 = _skip_1;
          do {
            iVar6 = iVar6 + -1;
            if (iVar6 == 0) break;
            std::__cxx11::string::assign((char *)&row_name);
            first_word((string *)&begin,&strline,sVar5);
            std::__cxx11::string::operator=((string *)&row_name,(string *)&begin);
            std::__cxx11::string::~string((string *)&begin);
            sVar5 = first_word_end(&strline,sVar5);
            this_00 = (HMpsFF *)&row_name;
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)this_00,"");
            if (bVar1) break;
            std::__cxx11::string::assign((char *)&coeff_name);
            first_word((string *)&begin,&strline,sVar5);
            std::__cxx11::string::operator=((string *)&coeff_name,(string *)&begin);
            std::__cxx11::string::~string((string *)&begin);
            sVar5 = first_word_end(&strline,sVar5);
            bVar1 = std::operator==(&coeff_name,"");
            if (bVar1) {
              trim(&row_name,&default_non_chars_abi_cxx11_);
              trim(&col_name,&default_non_chars_abi_cxx11_);
              highsLogUser((HighsLogOptions *)local_140,kError,
                           "%s has no coefficient for entry \"%s\" in column \"%s\"\n",
                           section_name._M_dataplus._M_p,row_name._M_dataplus._M_p,
                           col_name._M_dataplus._M_p);
              PVar2 = local_14c;
              goto LAB_0022630b;
            }
            this_00 = this;
            HVar3 = getColIdx(this,&row_name,true);
            is_nan = false;
            dVar7 = getValue(this_00,&coeff_name,&is_nan,(HighsInt)end_00);
            if (is_nan == true) {
              highsLogUser((HighsLogOptions *)local_140,kError,
                           "Hessian coefficient for entry \"%s\" in column \"%s\" is NaN\n",
                           row_name._M_dataplus._M_p,col_name._M_dataplus._M_p);
              PVar2 = local_14c;
              goto LAB_0022630b;
            }
            if ((dVar7 != 0.0) || (NAN(dVar7))) {
              if (local_11c == kQcmatrix) {
                if (local_144 <= HVar3) {
                  local_e8 = local_144;
                  this_00 = local_130;
                  begin = (size_t)dVar7;
                  local_e4 = HVar3;
                  std::vector<std::tuple<int,int,double>,std::allocator<std::tuple<int,int,double>>>
                  ::emplace_back<std::tuple<int,int,double>>
                            ((vector<std::tuple<int,int,double>,std::allocator<std::tuple<int,int,double>>>
                              *)local_130,(tuple<int,_int,_double> *)&begin);
                }
              }
              else {
                local_e8 = local_144;
                this_00 = local_130;
                begin = (size_t)dVar7;
                local_e4 = HVar3;
                std::vector<std::tuple<int,int,double>,std::allocator<std::tuple<int,int,double>>>::
                emplace_back<std::tuple<int,int,double>>
                          ((vector<std::tuple<int,int,double>,std::allocator<std::tuple<int,int,double>>>
                            *)local_130,(tuple<int,_int,_double> *)&begin);
              }
            }
          } while (sVar5 != strline._M_string_length);
        }
        goto LAB_0022609a;
      }
      goto LAB_0022630b;
    }
  }
  local_14c = kFail;
  do {
    do {
      bVar1 = getMpsLine(this_00,local_118,&strline,&skip_1);
      PVar2 = local_14c;
      if (!bVar1) goto LAB_0022630b;
    } while (skip_1 != false);
    bVar1 = timeout(this);
    if (bVar1) goto LAB_00226289;
    begin = 0;
    end = 0;
    this_00 = this;
    PVar2 = checkFirstWord(this,&strline,&begin,&end,&col_name);
  } while (PVar2 == kNone);
  highsLogDev((HighsLogOptions *)local_140,kInfo,"readMPS: Read %s  OK\n",
              section_name._M_dataplus._M_p);
  local_14c = PVar2;
LAB_0022630b:
  std::__cxx11::string::~string((string *)&rowname);
  std::__cxx11::string::~string((string *)&coeff_name);
  std::__cxx11::string::~string((string *)&row_name);
  std::__cxx11::string::~string((string *)&col_name);
  std::__cxx11::string::~string((string *)&strline);
  std::__cxx11::string::~string((string *)&section_name);
  return PVar2;
LAB_00226289:
  PVar2 = kTimeout;
  local_14c = kTimeout;
  goto LAB_0022630b;
}

Assistant:

typename HMpsFF::Parsekey HMpsFF::parseQuadRows(
    const HighsLogOptions& log_options, std::istream& file,
    const HMpsFF::Parsekey keyword) {
  // Parse Hessian information from QSECTION or QCMATRIX
  // section according to keyword
  const bool qcmatrix = keyword == HMpsFF::Parsekey::kQcmatrix;
  std::string section_name;
  if (qcmatrix) {
    section_name = "QCMATRIX";
  } else {
    section_name = "QSECTION";
  }
  std::string strline;
  std::string col_name;
  std::string row_name;
  std::string coeff_name;
  size_t end_row_name;
  size_t end_coeff_name;
  HighsInt rowidx;            // index of quadratic row
  HighsInt qcolidx, qrowidx;  // indices in quadratic coefs matrix

  // Get row name from section argument
  std::string rowname = first_word(section_args, 0);
  if (rowname.empty()) {
    highsLogUser(log_options, HighsLogType::kError,
                 "No row name given in argument of %s\n", section_name.c_str());
    return HMpsFF::Parsekey::kFail;
  }

  auto mit = rowname2idx.find(rowname);
  // if row of section does not exist or is free (index -2), then skip
  if (mit == rowname2idx.end() || mit->second == -2) {
    if (mit == rowname2idx.end()) {
      warning_issued_ = true;
      highsLogUser(log_options, HighsLogType::kWarning,
                   "Row name \"%s\" in %s section is not defined: ignored\n",
                   rowname.c_str(), section_name.c_str());
    }
    // read lines until start of new section
    bool skip;
    while (getMpsLine(file, strline, skip)) {
      if (skip) continue;
      if (timeout()) return HMpsFF::Parsekey::kTimeout;

      size_t begin = 0;
      size_t end = 0;
      HMpsFF::Parsekey key = checkFirstWord(strline, begin, end, col_name);

      // start of new section?
      if (key != Parsekey::kNone) {
        highsLogDev(log_options, HighsLogType::kInfo, "readMPS: Read %s  OK\n",
                    section_name.c_str());
        return key;
      }
    }
    return Parsekey::kFail;  // unexpected end of file
  }
  rowidx = mit->second;
  assert(rowidx >= -1);
  assert(rowidx < num_row);

  if (rowidx >= 0) qrows_entries.resize(num_row);
  assert(rowidx == -1 || qrows_entries.size() == static_cast<size_t>(num_row));

  auto& qentries = (rowidx == -1 ? q_entries : qrows_entries[rowidx]);

  bool skip;
  while (getMpsLine(file, strline, skip)) {
    if (skip) continue;
    if (timeout()) return HMpsFF::Parsekey::kTimeout;

    size_t begin = 0;
    size_t end = 0;
    HMpsFF::Parsekey key = checkFirstWord(strline, begin, end, col_name);

    // start of new section?
    if (key != Parsekey::kNone) {
      highsLogDev(log_options, HighsLogType::kInfo, "readMPS: Read %s  OK\n",
                  section_name.c_str());
      return key;
    }

    // Get the column index
    qcolidx = getColIdx(col_name);
    assert(qcolidx >= 0 && qcolidx < num_col);

    // Loop over the maximum of two entries per row of the file
    for (int entry = 0; entry < 2; entry++) {
      // Get the row name
      row_name = "";
      row_name = first_word(strline, end);
      end_row_name = first_word_end(strline, end);

      if (row_name == "") break;

      coeff_name = "";
      coeff_name = first_word(strline, end_row_name);
      end_coeff_name = first_word_end(strline, end_row_name);

      if (coeff_name == "") {
        trim(row_name);
        trim(col_name);
        highsLogUser(
            log_options, HighsLogType::kError,
            "%s has no coefficient for entry \"%s\" in column \"%s\"\n",
            section_name.c_str(), row_name.c_str(), col_name.c_str());
        return HMpsFF::Parsekey::kFail;
      }

      qrowidx = getColIdx(row_name);
      assert(qrowidx >= 0 && qrowidx < num_col);

      bool is_nan = false;
      double coeff = getValue(coeff_name, is_nan);  // atof(word.c_str());
      if (is_nan) {
        highsLogUser(
            log_options, HighsLogType::kError,
            "Hessian coefficient for entry \"%s\" in column \"%s\" is NaN\n",
            row_name.c_str(), col_name.c_str());
        return HMpsFF::Parsekey::kFail;
      }
      if (coeff) {
        if (qcmatrix) {
          // QCMATRIX has the whole Hessian, so store the entry if the
          // entry is in the lower triangle
          if (qrowidx >= qcolidx)
            qentries.push_back(std::make_tuple(qrowidx, qcolidx, coeff));
        } else {
          // QSECTION has the lower triangle of the Hessian
          qentries.push_back(std::make_tuple(qrowidx, qcolidx, coeff));
        }
      }
      end = end_coeff_name;
      // Don't read more if end of line reached
      if (end == strline.length()) break;
    }
  }

  return HMpsFF::Parsekey::kFail;
}